

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirINCBIN(void)

{
  bool bVar1;
  int iVar2;
  fullpath_ref_t file;
  aint length;
  aint offset;
  char *message;
  aint val;
  
  file = GetInputFile(&lp);
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (bVar1) {
      lp = lp + -1;
      offset = 0;
LAB_0010cbee:
      bVar1 = anyComma(&lp);
      length = 0x7fffffff;
      if ((!bVar1) || (iVar2 = ParseExpressionNoSyntaxError(&lp,&val), length = val, iVar2 != 0))
      goto LAB_0010cc1c;
      message = "[INCBIN] Syntax error in <length>";
    }
    else {
      iVar2 = ParseExpressionNoSyntaxError(&lp,&val);
      offset = val;
      if (iVar2 != 0) goto LAB_0010cbee;
      message = "[INCBIN] Syntax error in <offset>";
    }
    Error(message,bp,SUPPRESS);
  }
  else {
    offset = 0;
    length = 0x7fffffff;
LAB_0010cc1c:
    BinIncFile(file,offset,length);
  }
  return;
}

Assistant:

static void dirINCBIN() {
	int offset = 0, length = INT_MAX;
	fullpath_ref_t fnaam = GetInputFile(lp);
	if (anyComma(lp)) {
		aint val;
		if (!anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCBIN] Syntax error in <offset>", bp, SUPPRESS);
				return;
			}
			offset = val;
		} else --lp;		// there was second comma right after, reread it
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCBIN] Syntax error in <length>", bp, SUPPRESS);
				return;
			}
			length = val;
		}
	}
	BinIncFile(fnaam, offset, length);
}